

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

char * __thiscall
sisl::body_centered_cubic<char>::operator()
          (body_centered_cubic<char> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint *puVar4;
  ulong uVar5;
  
  uVar1 = vl->gp_offset;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 0x29) {
    vl->gp_offset = (uint)(uVar5 + 8);
    uVar2 = *(uint *)((long)vl->reg_save_area + uVar5);
    if (uVar1 < 0x21) {
      puVar4 = (uint *)(uVar5 + 8 + (long)vl->reg_save_area);
      vl->gp_offset = uVar1 + 0x10;
      goto LAB_0014f829;
    }
  }
  else {
    puVar4 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar4 + 2;
    uVar2 = *puVar4;
  }
  puVar4 = (uint *)vl->overflow_arg_area;
  vl->overflow_arg_area = puVar4 + 2;
LAB_0014f829:
  UNRECOVERED_JUMPTABLE = (this->super_base_lattice<char>)._vptr_base_lattice[1];
  iVar3 = (*UNRECOVERED_JUMPTABLE)(this,d0,(ulong)uVar2,(ulong)*puVar4,UNRECOVERED_JUMPTABLE);
  return (char *)CONCAT44(extraout_var,iVar3);
}

Assistant:

virtual const T& operator()(int d0, va_list vl) const {
            int _x = d0, _y = 0, _z = 0;
            int ax, ay, az;

            _y = va_arg(vl, int);
            _z = va_arg(vl, int);

            return this->operator()(_x, _y, _z);
        }